

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void load_buffer_8x16_avx2(int16_t *input,__m256i *out,int stride,int flipud,int fliplr,int shift)

{
  int16_t *tmp;
  int16_t *botL;
  int16_t *topL;
  int in_stack_00000050;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  __m256i *in_stack_00000060;
  int16_t *in_stack_00000068;
  
  load_buffer_8x8_avx2
            (in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000058,
             in_stack_00000054,in_stack_00000050);
  load_buffer_8x8_avx2
            (in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000058,
             in_stack_00000054,in_stack_00000050);
  return;
}

Assistant:

static inline void load_buffer_8x16_avx2(const int16_t *input, __m256i *out,
                                         int stride, int flipud, int fliplr,
                                         int shift) {
  const int16_t *topL = input;
  const int16_t *botL = input + 8 * stride;

  const int16_t *tmp;

  if (flipud) {
    tmp = topL;
    topL = botL;
    botL = tmp;
  }
  load_buffer_8x8_avx2(topL, out, stride, flipud, fliplr, shift);
  load_buffer_8x8_avx2(botL, out + 8, stride, flipud, fliplr, shift);
}